

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  vector<const_char_*,_std::allocator<const_char_*>_> views_00;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  pointer *pppcVar7;
  invalid_argument *this;
  long lVar8;
  byte bVar9;
  vector<const_char_*,_std::allocator<const_char_*>_> *__x;
  int iVar10;
  ulong uVar11;
  char **ppcVar12;
  vector<const_char_*,_std::allocator<const_char_*>_> inFiles;
  vector<const_char_*,_std::allocator<const_char_*>_> views;
  char *view;
  undefined8 in_stack_fffffffffffffef8;
  pointer ppcVar13;
  pointer ppcStack_f0;
  char *local_e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  char *local_b8;
  undefined8 local_b0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_90;
  vector<const_char_*,_std::allocator<const_char_*>_> local_78;
  vector<const_char_*,_std::allocator<const_char_*>_> local_60;
  vector<const_char_*,_std::allocator<const_char_*>_> local_48;
  
  ppcVar13 = (pointer)0x0;
  ppcStack_f0 = (pointer)0x0;
  iVar3 = 0;
  bVar9 = 0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_b8 = (char *)0x0;
  local_e0 = (char *)0x0;
  if (1 < argc) {
    ppcVar12 = argv + 1;
    lVar8 = (ulong)(uint)argc - 1;
    local_e0 = (char *)0x0;
    local_b0 = 0;
    do {
      pcVar4 = *ppcVar12;
      iVar1 = strcmp(pcVar4,"-h");
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar4,"--help"), iVar1 == 0)) {
        usageMessage((ostream *)&std::cout,"exrmultipart",true);
        goto LAB_00107ad6;
      }
      iVar1 = strcmp(pcVar4,"--version");
      if (iVar1 == 0) {
        pcVar4 = (char *)Imf_3_2::getLibraryVersion();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"exrmultipart (OpenEXR) ",0x17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.2.0",5);
        iVar3 = strcmp(pcVar4,"3.2.0");
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"(OpenEXR version ",0x11);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x111218);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," https://openexr.com",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
        goto LAB_00107ad6;
      }
      iVar2 = strcmp(pcVar4,"-i");
      iVar10 = 1;
      iVar1 = iVar10;
      if (iVar2 != 0) {
        iVar1 = strcmp(pcVar4,"-o");
        if (iVar1 == 0) {
          iVar1 = 2;
        }
        else {
          iVar1 = strcmp(pcVar4,"-override");
          if (iVar1 == 0) {
LAB_001073f1:
            iVar1 = 3;
          }
          else {
            iVar1 = strcmp(pcVar4,"-view");
            if (iVar1 == 0) {
              iVar1 = 4;
              if (iVar3 != 1) {
                this = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(this,"-view requires -i");
                goto LAB_00107b54;
              }
            }
            else {
              iVar1 = iVar3;
              switch(iVar3) {
              case 1:
                if (ppcStack_f0 == (pointer)0x0) {
                  std::vector<char_const*,std::allocator<char_const*>>::
                  _M_realloc_insert<char_const*const&>
                            ((vector<char_const*,std::allocator<char_const*>> *)
                             &stack0xffffffffffffff08,(iterator)0x0,ppcVar12);
                }
                else {
                  *ppcStack_f0 = pcVar4;
                  ppcStack_f0 = ppcStack_f0 + 1;
                }
                if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<char_const*,std::allocator<char_const*>>::
                  _M_realloc_insert<char_const*const&>
                            ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,
                             (iterator)
                             local_d8.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_b8);
                  iVar1 = iVar10;
                }
                else {
                  *local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_b8;
                  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                  iVar1 = iVar10;
                }
                break;
              case 2:
                local_e0 = pcVar4;
                break;
              case 3:
                iVar3 = atoi(pcVar4);
                local_b0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),iVar3 != 0);
                goto LAB_001073f1;
              case 4:
                iVar1 = iVar10;
                local_b8 = pcVar4;
              }
            }
          }
        }
      }
      iVar3 = iVar1;
      ppcVar12 = ppcVar12 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    bVar9 = (byte)local_b0;
  }
  if (ppcStack_f0 == ppcVar13) {
    iVar3 = 1;
    usageMessage((ostream *)&std::cerr,*argv,false);
    goto LAB_00107ad8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"input:",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  if (ppcStack_f0 != ppcVar13) {
    uVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      ",6);
      pcVar4 = ppcVar13[uVar11];
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x111218);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
      }
      if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," in view ",9);
        pcVar4 = local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x111218);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)ppcStack_f0 - (long)ppcVar13 >> 3));
  }
  if (local_e0 == (char *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"No output file specified");
LAB_00107b54:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ppcVar12 = argv;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"output:\n      ",0xe);
  sVar5 = strlen(local_e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_e0,sVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"override:",9);
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar4 = argv[1];
  iVar3 = strcmp(pcVar4,"-combine");
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-combine multipart input ",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&local_60,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffff08);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_78,&local_d8);
    combine(&local_60,&local_78,local_e0,(bool)(bVar9 & 1));
    if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      pppcVar7 = &local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_001079c4:
      operator_delete(local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)*pppcVar7 -
                      (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    iVar3 = strcmp(pcVar4,"-separate");
    if (iVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-separate multipart input ",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_90,
                 (vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffff08);
      separate(&local_90,local_e0,(bool)(bVar9 & 1));
      if (local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        pppcVar7 = &local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
        local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        goto LAB_001079c4;
      }
    }
    else {
      iVar3 = strcmp(pcVar4,"-convert");
      if (iVar3 != 0) {
        iVar3 = 0;
        usageMessage((ostream *)&std::cerr,*argv,false);
        goto LAB_00107ad8;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-convert input to EXR2 multipart",0x20);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_a8,
                 (vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffff08);
      __x = &local_d8;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_48,__x);
      views_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar12;
      views_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffef8;
      views_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppcVar13;
      convert(&local_a8,views_00,(char *)__x,SUB81(local_e0,0));
      if (local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        pppcVar7 = &local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
        goto LAB_001079c4;
      }
    }
  }
LAB_00107ad6:
  iVar3 = 0;
LAB_00107ad8:
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (ppcVar13 != (pointer)0x0) {
    operator_delete(ppcVar13,-(long)ppcVar13);
  }
  return iVar3;
}

Assistant:

int
main (int argc, char* argv[])
{
    try {
        
        vector<const char*> inFiles;
        vector<const char*> views;
        const char*         view     = 0;
        const char*         outFile  = 0;
        bool                override = false;

        int i = 1;
        int mode = 0; // 0-do not read input, 1-infiles, 2-outfile, 3-override, 4-view

        while (i < argc)
        {
            if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))     
            {
                usageMessage (cout, "exrmultipart", true);
                return 0;
            }

            if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrmultipart (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }

            if (!strcmp (argv[i], "-i"))
            {
                mode = 1;
            }
            else if (!strcmp (argv[i], "-o"))
            {
                mode = 2;
            }
            else if (!strcmp (argv[i], "-override"))
            {
                mode = 3;
            }
            else if (!strcmp (argv[i], "-view"))
            {
                if (mode != 1)
                    throw invalid_argument("-view requires -i");

                mode = 4;
            }
            else
            {
                switch (mode)
                {
                  case 1:
                      inFiles.push_back (argv[i]);
                      views.push_back (view);
                      break;
                  case 2: outFile = argv[i]; break;
                  case 3: override = atoi (argv[i]); break;
                  case 4:
                      view = argv[i];
                      mode = 1;
                      break;
                }
            }
            i++;
        }

        // check input and output files found or not
        if (inFiles.size () == 0)
        {
            usageMessage(cerr, argv[0], false);
            return 1;
        }

        cout << "input:" << endl;
        for (size_t i = 0; i < inFiles.size (); i++)
        {
            cout << "      " << inFiles[i];
            if (views[i])
                cout << " in view " << views[i];
            cout << endl;
        }

        if (!outFile)
            throw invalid_argument("No output file specified");

        cout << "output:\n      " << outFile << endl;
        cout << "override:" << override << "\n" << endl;

        if (!strcmp (argv[1], "-combine"))
        {
            cout << "-combine multipart input " << endl;
            combine (inFiles, views, outFile, override);
        }
        else if (!strcmp (argv[1], "-separate"))
        {
            cout << "-separate multipart input " << endl;
            separate (inFiles, outFile, override);
        }
        else if (!strcmp (argv[1], "-convert"))
        {
            cout << "-convert input to EXR2 multipart" << endl;
            convert (inFiles, views, outFile, override);
        }
        else
        {
            usageMessage (cerr, argv[0], false);
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }
    
    return 0;
}